

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

void lj_cdata_set(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo qual)

{
  uint local_bc;
  CTInfo qual_local;
  TValue *o_local;
  uint8_t *dp_local;
  CType *d_local;
  CTState *cts_local;
  
  if (d->info >> 0x1c != 0xb) {
    if (d->info >> 0x1c == 10) {
      if (((d->info | qual) & 0x2000000) == 0) {
        lj_cconv_bf_tv(cts,d,dp,o);
        return;
      }
    }
    else {
      dp_local = (uint8_t *)(cts->tab + (d->info & 0xffff));
      local_bc = qual;
      o_local = (TValue *)dp;
      if ((((CType *)dp_local)->info & 0xf0800000) == 0x20800000) {
        o_local = *(TValue **)dp;
        dp_local = (uint8_t *)(cts->tab + (((CType *)dp_local)->info & 0xffff));
      }
      for (; *(uint *)dp_local >> 0x1c == 8;
          dp_local = (uint8_t *)(cts->tab + (*(uint *)dp_local & 0xffff))) {
        if ((*(uint *)dp_local >> 0x10 & 0xff) == 1) {
          local_bc = *(uint *)(dp_local + 4) | local_bc;
        }
      }
      if (((*(uint *)dp_local | local_bc) & 0x2000000) == 0) {
        lj_cconv_ct_tv(cts,(CType *)dp_local,(uint8_t *)&o_local->u64,o,0);
        return;
      }
    }
  }
  lj_err_caller(cts->L,LJ_ERR_FFI_WRCONST);
}

Assistant:

void lj_cdata_set(CTState *cts, CType *d, uint8_t *dp, TValue *o, CTInfo qual)
{
  if (ctype_isconstval(d->info)) {
    goto err_const;
  } else if (ctype_isbitfield(d->info)) {
    if (((d->info|qual) & CTF_CONST)) goto err_const;
    lj_cconv_bf_tv(cts, d, dp, o);
    return;
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(d->info) || ctype_isfield(d->info),
	       "pointer or field expected");
  d = ctype_child(cts, d);

  /* Resolve reference for field. */
  if (ctype_isref(d->info)) {
    lj_assertCTS(d->size == CTSIZE_PTR, "ref is not pointer-sized");
    dp = *(uint8_t **)dp;
    d = ctype_child(cts, d);
  }

  /* Skip attributes and collect qualifiers. */
  for (;;) {
    if (ctype_isattrib(d->info)) {
      if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
    } else {
      break;
    }
    d = ctype_child(cts, d);
  }

  lj_assertCTS(ctype_hassize(d->info), "store to ctype without size");
  lj_assertCTS(!ctype_isvoid(d->info), "store to void type");

  if (((d->info|qual) & CTF_CONST)) {
  err_const:
    lj_err_caller(cts->L, LJ_ERR_FFI_WRCONST);
  }

  lj_cconv_ct_tv(cts, d, dp, o, 0);
}